

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::indexForBucket(Impl *this,HashedValue *key,string *bucket)

{
  KeyValueStore *pKVar1;
  __uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  this_00;
  size_t length;
  size_t hash;
  Set keys;
  EncodedValue idxKey;
  __uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  local_d8;
  undefined1 local_d0 [32];
  pointer local_b0;
  pointer local_a8;
  undefined4 local_8c;
  Bytes local_88;
  EncodedValue local_70;
  size_t local_30;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "bucket::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bucket);
  groundupdb::EncodedValue::EncodedValue(&local_70,(string *)local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  pKVar1 = (this->m_indexStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  groundupdb::HashedValue::HashedValue((HashedValue *)local_d0,&local_70);
  (*(pKVar1->super_Store)._vptr_Store[5])(&local_d8,pKVar1,local_d0);
  local_d0._0_8_ = &PTR__HashedValue_001d3818;
  if ((void *)local_d0._16_8_ != (void *)0x0) {
    operator_delete((void *)local_d0._16_8_,(long)local_b0 - local_d0._16_8_);
  }
  this_00._M_t.
  super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
  ._M_head_impl =
       local_d8._M_t.
       super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
       .
       super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
       ._M_head_impl;
  groundupdb::HashedValue::data(&local_88,key);
  length = groundupdb::HashedValue::length(key);
  hash = groundupdb::HashedValue::hash(key);
  local_d0[0] = 1;
  local_d0._4_4_ = 1;
  groundupdb::HashedValue::HashedValue((HashedValue *)(local_d0 + 8),&local_88,length,hash);
  std::
  _Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::find((_Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          *)this_00._M_t.
            super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
            .
            super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
            ._M_head_impl,(key_type *)local_d0);
  local_d0._8_8_ = &PTR__HashedValue_001d3818;
  if ((void *)local_d0._24_8_ != (void *)0x0) {
    operator_delete((void *)local_d0._24_8_,(long)local_a8 - local_d0._24_8_);
  }
  if (local_88.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  local_8c = 1;
  groundupdb::HashedValue::data((Bytes *)local_d0,key);
  local_88.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)groundupdb::HashedValue::length(key);
  local_30 = groundupdb::HashedValue::hash(key);
  std::
  _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_emplace<groundupdb::Type,std::vector<std::byte,std::allocator<std::byte>>const,unsigned_long,unsigned_long>
            ((_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_d8._M_t.
                super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
                .
                super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
                ._M_head_impl,&local_8c,local_d0,&local_88);
  if ((pointer)local_d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ - local_d0._0_8_);
  }
  pKVar1 = (this->m_indexStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  groundupdb::HashedValue::HashedValue((HashedValue *)local_d0,&local_70);
  (*(pKVar1->super_Store)._vptr_Store[4])(pKVar1,local_d0,&local_d8);
  local_d0._0_8_ = &PTR__HashedValue_001d3818;
  if ((void *)local_d0._16_8_ != (void *)0x0) {
    operator_delete((void *)local_d0._16_8_,(long)local_b0 - local_d0._16_8_);
  }
  std::
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  ::~unique_ptr((unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
                 *)&local_d8);
  local_70.m_value._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d3818;
  if (local_70.m_value.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.m_value.m_data.
                    super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.m_value.m_data.
                          super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.m_value.m_data.
                          super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void EmbeddedDatabase::Impl::indexForBucket(const HashedValue& key,const std::string& bucket) {
  // Add to bucket index
  EncodedValue idxKey("bucket::" + bucket);
  // query the key index
  //std::cout << "indexForBucket Fetching key set" << std::endl;
  Set keys = m_indexStore->getKeyValueSet(idxKey);
  //std::cout << "indexForBucket size currently: " << keys->size() << std::endl;
  //for (auto kiter = keys->begin();kiter != keys->end();kiter++) {
  //  std::cout << "  EncodedValue has value?: " << kiter->hasValue() << ", length: " << kiter->length() << ", hash: " << kiter->hash() << std::endl;
  //}
  //std::cout << "indexForBucket adding key" << std::endl;
  auto found = keys->find(EncodedValue(groundupdb::Type::KEY,key.data(),key.length(),key.hash()));
  //if (found != keys->end()) {
  //  std::cout << "WARNING: Specified value already exists in the set" << std::endl;
  //}
  keys->emplace(groundupdb::Type::KEY,key.data(),key.length(),key.hash());
  //std::cout << "indexForBucket size will now be: " << keys->size() << std::endl;
  //for (auto kiter = keys->begin();kiter != keys->end();kiter++) {
  //  std::cout << "  Now EncodedValue has value?: " << kiter->hasValue() << ", length: " << kiter->length() << ", hash: " << kiter->hash() << std::endl;
  //}
  //std::cout << "indexForBucket Setting kv" << std::endl;
  m_indexStore->setKeyValue(idxKey,std::move(keys)); // TODO do we need this? Yes - may not be in memory store
  // TODO replace the above with appendKeyValue(key,value)
}